

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O3

void __thiscall
DataSourceDOS::SpriteDosTransparent::SpriteDosTransparent
          (SpriteDosTransparent *this,PBuffer *_data,ColorDOS *palette,uint8_t color)

{
  byte bVar1;
  uchar value;
  uchar value_00;
  element_type *peVar2;
  byte *pbVar3;
  bool bVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  PMutableBuffer result;
  undefined1 local_59;
  MutableBuffer *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  PBuffer local_48;
  EndianessMode local_34;
  
  local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  SpriteBaseDOS::SpriteBaseDOS(&this->super_SpriteBaseDOS,&local_48);
  if (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (this->super_SpriteBaseDOS).super_SpriteBase.super_Sprite._vptr_Sprite =
       (_func_int **)&PTR_get_data_00156ed8;
  local_34 = EndianessBig;
  std::__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<MutableBuffer>,Buffer::EndianessMode>
            ((__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<MutableBuffer> *)&local_59,&local_34);
  while (bVar4 = Buffer::readable((_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr), bVar4) {
    peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pbVar3 = peVar2->read;
    bVar1 = *pbVar3;
    peVar2->read = pbVar3 + 1;
    MutableBuffer::push<unsigned_int>(local_58,0,(ulong)bVar1);
    peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pbVar3 = peVar2->read;
    bVar1 = *pbVar3;
    peVar2->read = pbVar3 + 1;
    for (uVar7 = (ulong)bVar1; uVar7 != 0; uVar7 = uVar7 - 1) {
      peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pbVar3 = peVar2->read;
      uVar6 = (ulong)*pbVar3;
      peVar2->read = pbVar3 + 1;
      value = palette[color + uVar6].r;
      value_00 = palette[color + uVar6].g;
      MutableBuffer::push<unsigned_char>(local_58,palette[color + uVar6].b,1);
      MutableBuffer::push<unsigned_char>(local_58,value_00,1);
      MutableBuffer::push<unsigned_char>(local_58,value,1);
      MutableBuffer::push<unsigned_char>(local_58,0xff,1);
    }
  }
  puVar5 = (uint8_t *)MutableBuffer::unfix(local_58);
  (this->super_SpriteBaseDOS).super_SpriteBase.data = puVar5;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

DataSourceDOS::SpriteDosTransparent::SpriteDosTransparent(PBuffer _data,
                                                          ColorDOS *palette,
                                                          uint8_t color)
  : SpriteBaseDOS(_data) {
  PMutableBuffer result = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (_data->readable()) {
    size_t drop = _data->pop<uint8_t>();
    result->push<uint32_t>(0x00000000, drop);

    size_t fill = _data->pop<uint8_t>();
    for (size_t i = 0; i < fill; i++) {
      unsigned int p_index = _data->pop<uint8_t>() + color;  // color_off;
      ColorDOS color = palette[p_index];
      result->push<uint8_t>(color.b);  // Blue
      result->push<uint8_t>(color.g);  // Green
      result->push<uint8_t>(color.r);  // Red
      result->push<uint8_t>(0xFF);     // Alpha
    }
  }

  data = reinterpret_cast<uint8_t*>(result->unfix());
}